

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  cf_bool_t cVar1;
  cf_int32_t cVar2;
  cf_size_t cVar3;
  char *__assertion;
  cf_char_t s1 [12];
  cf_char_t s [10];
  cf_char_t buf [100];
  
  builtin_memcpy(s,"  12345\t ",10);
  builtin_memcpy(s1,"a1234bcdefg",0xc);
  cVar1 = cf_str_strip(s);
  if (cVar1 == 0) {
    __assertion = "cf_str_strip(s)";
    __line = 0xc;
  }
  else {
    cVar2 = cf_strcmp("12345",s);
    if (cVar2 == 0) {
      cVar1 = cf_str_capitalize(s1);
      if (cVar1 == 0) {
        __assertion = "cf_str_capitalize(s1)";
        __line = 0xf;
      }
      else {
        cVar2 = cf_strcmp(s1,"A1234bcdefg");
        if (cVar2 == 0) {
          cVar1 = cf_str_switch_case(s1);
          if (cVar1 == 0) {
            __assertion = "cf_str_switch_case(s1)";
            __line = 0x12;
          }
          else {
            cVar2 = cf_strcmp(s1,"a1234BCDEFG");
            if (cVar2 == 0) {
              cVar1 = cf_str_to_upper(s1);
              if (cVar1 == 0) {
                __assertion = "cf_str_to_upper(s1)";
                __line = 0x15;
              }
              else {
                cVar2 = cf_strcmp(s1,"A1234BCDEFG");
                if (cVar2 == 0) {
                  cVar1 = cf_str_to_lower(s1);
                  if (cVar1 == 0) {
                    __assertion = "cf_str_to_lower(s1)";
                    __line = 0x18;
                  }
                  else {
                    cVar2 = cf_strcmp(s1,"a1234bcdefg");
                    if (cVar2 == 0) {
                      cVar3 = cf_str_count_for("11223311",'1');
                      if (cVar3 == 4) {
                        cf_str_center(buf,100,"abcde",'*',10);
                        cVar2 = cf_strcmp(buf,"**abcde***");
                        if (cVar2 == 0) {
                          return 0;
                        }
                        __assertion = "cf_strcmp(buf, \"**abcde***\") == 0";
                        __line = 0x1e;
                      }
                      else {
                        __assertion = "cf_str_count_for(\"11223311\", \'1\') == 4";
                        __line = 0x1b;
                      }
                    }
                    else {
                      __assertion = "cf_strcmp(s1, \"a1234bcdefg\") == 0";
                      __line = 0x19;
                    }
                  }
                }
                else {
                  __assertion = "cf_strcmp(s1, \"A1234BCDEFG\") == 0";
                  __line = 0x16;
                }
              }
            }
            else {
              __assertion = "cf_strcmp(s1, \"a1234BCDEFG\") == 0";
              __line = 0x13;
            }
          }
        }
        else {
          __assertion = "cf_strcmp(s1, \"A1234bcdefg\") == 0";
          __line = 0x10;
        }
      }
    }
    else {
      __assertion = "cf_strcmp(\"12345\", s) == 0";
      __line = 0xd;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    cf_char_t s[] = "  12345\t ";
    cf_char_t s1[] = "a1234bcdefg";

    cf_char_t buf[100];

    cf_assert(cf_str_strip(s));
    cf_assert(cf_strcmp("12345", s) == 0);

    cf_assert(cf_str_capitalize(s1));
    cf_assert(cf_strcmp(s1, "A1234bcdefg") == 0);

    cf_assert(cf_str_switch_case(s1));
    cf_assert(cf_strcmp(s1, "a1234BCDEFG") == 0);

    cf_assert(cf_str_to_upper(s1));
    cf_assert(cf_strcmp(s1, "A1234BCDEFG") == 0);

    cf_assert(cf_str_to_lower(s1));
    cf_assert(cf_strcmp(s1, "a1234bcdefg") == 0);

    cf_assert(cf_str_count_for("11223311", '1') == 4);

    cf_str_center(buf, 100, "abcde", '*', 10);
    cf_assert(cf_strcmp(buf, "**abcde***") == 0);
    return 0;
}